

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O0

HeapType __thiscall wasm::anon_unknown_0::TypeMerging::getMerged(TypeMerging *this,HeapType type)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> local_30;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> local_28;
  iterator it;
  TypeMerging *this_local;
  HeapType type_local;
  
  it.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>)this;
  this_local = (TypeMerging *)type.id;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
       ::find(&this->merges,(key_type *)&this_local);
  while( true ) {
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
         ::end(&this->merges);
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>
                         *)&local_28);
    this_local = (TypeMerging *)(ppVar2->second).id;
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
         ::find(&this->merges,(key_type *)&this_local);
  }
  return (HeapType)(uintptr_t)this_local;
}

Assistant:

HeapType getMerged(HeapType type) {
    for (auto it = merges.find(type); it != merges.end();
         it = merges.find(type)) {
      type = it->second;
    }
    return type;
  }